

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

ReservedChars __thiscall wabt::WastLexer::ReadReservedChars(WastLexer *this)

{
  byte *pbVar1;
  bool bVar2;
  ReservedChars RVar3;
  uint uVar4;
  Token local_60;
  
  RVar3 = None;
  do {
    pbVar1 = (byte *)this->cursor_;
    uVar4 = 0xffffffff;
    if (pbVar1 < this->buffer_end_) {
      uVar4 = (uint)*pbVar1;
    }
    if ((""[uVar4 + 1] & 1U) == 0) {
      if (uVar4 == 0x22) {
        GetStringToken(&local_60,this);
        bVar2 = true;
        RVar3 = Some;
      }
      else {
        bVar2 = false;
      }
    }
    else {
      if (pbVar1 < this->buffer_end_) {
        this->cursor_ = (char *)(pbVar1 + 1);
      }
      if (RVar3 == None) {
        RVar3 = Id;
      }
      bVar2 = true;
    }
  } while (bVar2);
  return RVar3;
}

Assistant:

WastLexer::ReservedChars WastLexer::ReadReservedChars() {
  ReservedChars ret{ReservedChars::None};
  while (true) {
    auto peek = PeekChar();
    if (IsIdChar(peek)) {
      ReadChar();
      if (ret == ReservedChars::None) {
        ret = ReservedChars::Id;
      }
    } else if (peek == '"') {
      GetStringToken();
      ret = ReservedChars::Some;
    } else {
      break;
    }
  }
  return ret;
}